

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O1

int uv_inet_pton(int af,char *src,void *dst)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  void *pvVar7;
  char cVar8;
  long lVar9;
  long lVar10;
  ushort uVar11;
  char *pcVar12;
  bool bVar13;
  uchar tmp_1 [16];
  char tmp [46];
  long local_98;
  uchar *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  char local_68 [56];
  
  iVar3 = -0x16;
  if (dst != (void *)0x0 && src != (char *)0x0) {
    if (af == 10) {
      pcVar6 = strchr(src,0x25);
      if (pcVar6 == (char *)0x0) {
        local_70 = (undefined8 *)dst;
      }
      else {
        iVar3 = (int)pcVar6 - (int)src;
        if (0x2d < iVar3) {
          return -0x16;
        }
        local_70 = (undefined8 *)dst;
        memcpy(local_68,src,(long)iVar3);
        local_68[iVar3] = '\0';
        src = local_68;
      }
      local_88 = 0;
      uStack_80 = 0;
      if (*src == ':') {
        if (src[1] != ':') {
          return -0x16;
        }
        src = src + 1;
      }
      local_90 = (uchar *)0x0;
      local_98 = 0;
      iVar3 = 0;
      uVar4 = 0;
      pcVar6 = src;
      do {
        uVar11 = (ushort)uVar4;
        pcVar12 = pcVar6 + 1;
        cVar2 = *pcVar6;
        if (cVar2 == '\0') goto LAB_00160f0d;
        iVar5 = 0x16c830;
        pvVar7 = memchr("0123456789abcdef",(int)cVar2,0x11);
        if (pvVar7 == (void *)0x0) {
          iVar5 = 0x16c850;
          pvVar7 = memchr("0123456789ABCDEF",(int)cVar2,0x11);
        }
        lVar9 = local_98;
        if (pvVar7 == (void *)0x0) {
          cVar8 = '\x01';
          if (cVar2 == '.') {
            if (local_98 < 0xd) {
              lVar1 = local_98 + 4;
              iVar5 = inet_pton4(src,(uchar *)((long)&local_88 + local_98));
              local_98 = lVar9;
              if (iVar5 == 0) {
                iVar3 = 0;
                local_98 = lVar1;
              }
              cVar8 = (iVar5 == 0) * '\x02' + '\x01';
            }
          }
          else if (cVar2 == ':') {
            src = pcVar12;
            if (iVar3 == 0) {
              bVar13 = local_90 == (uchar *)0x0;
              if (bVar13) {
                local_90 = (uchar *)((long)&local_88 + local_98);
              }
              cVar8 = bVar13 + '\x01';
              iVar3 = 0;
            }
            else if ((*pcVar12 != '\0') && (local_98 < 0xf)) {
              *(ushort *)((long)&local_88 + local_98) = uVar11 << 8 | uVar11 >> 8;
              local_98 = local_98 + 2;
              cVar8 = '\x02';
              iVar3 = 0;
              uVar4 = 0;
            }
          }
        }
        else {
          uVar4 = (int)pvVar7 - iVar5 | uVar4 << 4;
          cVar8 = (iVar3 < 4) + '\x01';
          iVar3 = iVar3 + 1;
        }
        uVar11 = (ushort)uVar4;
        pcVar6 = pcVar12;
      } while (cVar8 == '\x02');
      if (cVar8 == '\x03') {
LAB_00160f0d:
        if (iVar3 != 0) {
          if (0xe < local_98) {
            return -0x16;
          }
          *(ushort *)((long)&local_88 + local_98) = uVar11 << 8 | uVar11 >> 8;
          local_98 = local_98 + 2;
        }
        lVar9 = local_98;
        if (local_90 != (uchar *)0x0) {
          if (local_98 != 0x10) {
            uVar4 = ((int)&local_98 + (int)local_98 + 0x10) - (int)local_90;
            lVar9 = 0x10;
            if (0 < (int)uVar4) {
              lVar1 = (ulong)(uVar4 & 0x7fffffff) - 1;
              lVar10 = 0;
              do {
                *(uchar *)((long)&uStack_80 + lVar10 + 7) = local_90[lVar10 + lVar1];
                local_90[lVar10 + lVar1] = '\0';
                lVar10 = lVar10 + -1;
              } while (1 - (ulong)(uVar4 + 1) != lVar10);
            }
          }
          if (local_98 == 0x10) {
            return -0x16;
          }
        }
        iVar3 = -0x16;
        if (lVar9 == 0x10) {
          *local_70 = local_88;
          local_70[1] = uStack_80;
          iVar3 = 0;
        }
      }
      else {
        iVar3 = -0x16;
      }
    }
    else {
      iVar3 = -0x61;
      if (af == 2) {
        iVar3 = inet_pton4(src,(uchar *)dst);
        return iVar3;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_inet_pton(int af, const char* src, void* dst) {
  if (src == NULL || dst == NULL)
    return UV_EINVAL;

  switch (af) {
  case AF_INET:
    return (inet_pton4(src, dst));
  case AF_INET6: {
    int len;
    char tmp[UV__INET6_ADDRSTRLEN], *s, *p;
    s = (char*) src;
    p = strchr(src, '%');
    if (p != NULL) {
      s = tmp;
      len = p - src;
      if (len > UV__INET6_ADDRSTRLEN-1)
        return UV_EINVAL;
      memcpy(s, src, len);
      s[len] = '\0';
    }
    return inet_pton6(s, dst);
  }
  default:
    return UV_EAFNOSUPPORT;
  }
  /* NOTREACHED */
}